

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int attach_set_incomplete_unsettled(ATTACH_HANDLE attach,_Bool incomplete_unsettled_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  ATTACH_INSTANCE *attach_instance;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    iVar2 = 0x12a6;
  }
  else {
    item_value = amqpvalue_create_boolean(incomplete_unsettled_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x12ae;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(attach->composite_value,8,item_value);
      iVar2 = 0x12b4;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int attach_set_incomplete_unsettled(ATTACH_HANDLE attach, bool incomplete_unsettled_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE incomplete_unsettled_amqp_value = amqpvalue_create_boolean(incomplete_unsettled_value);
        if (incomplete_unsettled_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 8, incomplete_unsettled_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(incomplete_unsettled_amqp_value);
        }
    }

    return result;
}